

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::call_match
          (Dynamic_Object_Constructor *this,Function_Params *vals,
          Type_Conversions_State *t_conversions)

{
  initializer_list<chaiscript::Boxed_Value> __l;
  int iVar1;
  Boxed_Value *__first;
  Boxed_Value *__last;
  element_type *peVar2;
  Boxed_Value *local_128;
  Function_Params local_110;
  Boxed_Value *local_100;
  __normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_f8;
  const_iterator local_f0;
  allocator<chaiscript::Boxed_Value> local_e6;
  undefined1 local_e5;
  string local_d8;
  Dynamic_Object local_b8;
  undefined1 *local_60;
  undefined1 local_58 [16];
  Boxed_Value local_48;
  undefined1 local_38 [8];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> new_vals;
  Type_Conversions_State *t_conversions_local;
  Function_Params *vals_local;
  Dynamic_Object_Constructor *this_local;
  
  local_e5 = 1;
  local_60 = local_58;
  new_vals.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)t_conversions;
  std::__cxx11::string::string((string *)&local_d8,&this->m_type_name);
  Dynamic_Object::Dynamic_Object(&local_b8,&local_d8);
  Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
            ((Boxed_Value *)local_58,&local_b8,false);
  local_e5 = 0;
  local_48.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_58;
  local_48.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  std::allocator<chaiscript::Boxed_Value>::allocator(&local_e6);
  __l._M_len = (size_type)
               local_48.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_48.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_38,
             __l,&local_e6);
  std::allocator<chaiscript::Boxed_Value>::~allocator(&local_e6);
  local_128 = &local_48;
  do {
    local_128 = local_128 + -1;
    Boxed_Value::~Boxed_Value(local_128);
  } while (local_128 != (Boxed_Value *)local_58);
  Dynamic_Object::~Dynamic_Object(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_f8._M_current =
       (Boxed_Value *)
       std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                 ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                  local_38);
  __gnu_cxx::
  __normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
  ::__normal_iterator<chaiscript::Boxed_Value*>
            ((__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
              *)&local_f0,&local_f8);
  __first = Function_Params::begin(vals);
  __last = Function_Params::end(vals);
  local_100 = (Boxed_Value *)
              std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
              insert<chaiscript::Boxed_Value_const*,void>
                        ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)
                         local_38,local_f0,__first,__last);
  peVar2 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_func);
  Function_Params::Function_Params
            (&local_110,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_38);
  iVar1 = (*peVar2->_vptr_Proxy_Function_Base[3])
                    (peVar2,&local_110,
                     new_vals.
                     super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_38);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool call_match(const chaiscript::Function_Params &vals, const Type_Conversions_State &t_conversions) const override {
          std::vector<Boxed_Value> new_vals{Boxed_Value(Dynamic_Object(m_type_name))};
          new_vals.insert(new_vals.end(), vals.begin(), vals.end());

          return m_func->call_match(chaiscript::Function_Params{new_vals}, t_conversions);
        }